

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O3

void __thiscall
cbtSimulationIslandManager::buildIslands
          (cbtSimulationIslandManager *this,cbtDispatcher *dispatcher,
          cbtCollisionWorld *collisionWorld)

{
  int iVar1;
  cbtElement *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObject *this_00;
  cbtPersistentManifold **ptr;
  int iVar4;
  uint uVar5;
  cbtPersistentManifold *pcVar6;
  cbtPersistentManifold **ppcVar7;
  int iVar8;
  ulong uVar9;
  int i;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  CProfileSample __profile;
  CProfileSample local_49;
  cbtCollisionWorld *local_48;
  cbtDispatcher *local_40;
  cbtSimulationIslandManager *local_38;
  undefined4 extraout_var;
  
  local_48 = collisionWorld;
  local_40 = dispatcher;
  CProfileSample::CProfileSample(&local_49,"islandUnionFindAndQuickSort");
  lVar12 = (long)(this->m_islandmanifold).m_size;
  if (lVar12 < 0) {
    if ((this->m_islandmanifold).m_capacity < 0) {
      ppcVar7 = (this->m_islandmanifold).m_data;
      if ((ppcVar7 != (cbtPersistentManifold **)0x0) &&
         ((this->m_islandmanifold).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ppcVar7);
      }
      (this->m_islandmanifold).m_ownsMemory = true;
      (this->m_islandmanifold).m_data = (cbtPersistentManifold **)0x0;
      (this->m_islandmanifold).m_capacity = 0;
    }
    do {
      (this->m_islandmanifold).m_data[lVar12] = (cbtPersistentManifold *)0x0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
  }
  (this->m_islandmanifold).m_size = 0;
  cbtUnionFind::sortIslands(&this->m_unionFind);
  iVar4 = (this->m_unionFind).m_elements.m_size;
  if ((long)iVar4 < 1) {
LAB_008b75ed:
    iVar4 = (*local_40->_vptr_cbtDispatcher[9])();
    if (0 < iVar4) {
      iVar14 = 0;
      do {
        iVar15 = (*local_40->_vptr_cbtDispatcher[10])();
        pcVar6 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar15);
        if (((local_48->m_dispatchInfo).m_deterministicOverlappingPairs != true) ||
           (pcVar6->m_cachedPoints != 0)) {
          pcVar3 = pcVar6->m_body0;
          this_00 = pcVar6->m_body1;
          if (((pcVar3 != (cbtCollisionObject *)0x0) && (pcVar3->m_activationState1 != 2)) ||
             ((this_00 != (cbtCollisionObject *)0x0 && (this_00->m_activationState1 != 2)))) {
            if (((pcVar3->m_collisionFlags & 2U) != 0) &&
               (((pcVar3->m_collisionFlags & 4U) == 0 && (pcVar3->m_activationState1 != 2)))) {
              cbtCollisionObject::activate(this_00,false);
            }
            if ((((this_00->m_collisionFlags & 2U) != 0) && ((this_00->m_collisionFlags & 4U) == 0))
               && (this_00->m_activationState1 != 2)) {
              cbtCollisionObject::activate(pcVar3,false);
            }
            if ((this->m_splitIslands == true) &&
               (iVar15 = (*local_40->_vptr_cbtDispatcher[7])(local_40,pcVar3,this_00),
               (char)iVar15 != '\0')) {
              uVar5 = (this->m_islandmanifold).m_size;
              if (uVar5 == (this->m_islandmanifold).m_capacity) {
                iVar15 = uVar5 * 2;
                if (uVar5 == 0) {
                  iVar15 = 1;
                }
                if ((int)uVar5 < iVar15) {
                  if (iVar15 == 0) {
                    ppcVar7 = (cbtPersistentManifold **)0x0;
                  }
                  else {
                    ppcVar7 = (cbtPersistentManifold **)
                              cbtAlignedAllocInternal((long)iVar15 << 3,0x10);
                    uVar5 = (this->m_islandmanifold).m_size;
                  }
                  if (0 < (int)uVar5) {
                    uVar9 = 0;
                    do {
                      ppcVar7[uVar9] = (this->m_islandmanifold).m_data[uVar9];
                      uVar9 = uVar9 + 1;
                    } while (uVar5 != uVar9);
                  }
                  ptr = (this->m_islandmanifold).m_data;
                  if ((ptr != (cbtPersistentManifold **)0x0) &&
                     ((this->m_islandmanifold).m_ownsMemory == true)) {
                    cbtAlignedFreeInternal(ptr);
                    uVar5 = (this->m_islandmanifold).m_size;
                  }
                  (this->m_islandmanifold).m_ownsMemory = true;
                  (this->m_islandmanifold).m_data = ppcVar7;
                  (this->m_islandmanifold).m_capacity = iVar15;
                }
              }
              (this->m_islandmanifold).m_data[(int)uVar5] = pcVar6;
              (this->m_islandmanifold).m_size = uVar5 + 1;
            }
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar4);
    }
    CProfileSample::~CProfileSample(&local_49);
    return;
  }
  iVar14 = 0;
  local_38 = this;
LAB_008b74c8:
  pcVar2 = (local_38->m_unionFind).m_elements.m_data;
  lVar12 = (long)iVar14;
  iVar15 = iVar14 + 1;
  if (iVar14 + 1 < iVar4) {
    iVar15 = iVar4;
  }
  iVar1 = pcVar2[lVar12].m_id;
  iVar11 = iVar14;
  lVar13 = lVar12;
  do {
    iVar10 = iVar11;
    lVar13 = lVar13 + 1;
    iVar11 = iVar15;
    iVar8 = iVar15 + -1;
    if (iVar4 <= lVar13) break;
    iVar11 = iVar10 + 1;
    iVar8 = iVar10;
  } while (pcVar2[lVar13].m_id == iVar1);
  if (iVar14 <= iVar8) {
    lVar13 = 0;
    iVar15 = (iVar8 - iVar14) + 1;
LAB_008b7523:
    pcVar3 = (local_48->m_collisionObjects).m_data[pcVar2[lVar12 + lVar13].m_sz];
    if ((pcVar3->m_islandTag1 != iVar1) ||
       ((iVar10 = pcVar3->m_activationState1, iVar10 != 4 && (iVar10 != 1)))) goto LAB_008b7547;
    iVar14 = (iVar8 - iVar14) + 1;
    do {
      pcVar3 = (local_48->m_collisionObjects).m_data
               [(local_38->m_unionFind).m_elements.m_data[lVar12].m_sz];
      if ((pcVar3->m_islandTag1 == iVar1) && (pcVar3->m_activationState1 == 2)) {
        cbtCollisionObject::setActivationState(pcVar3,3);
        pcVar3->m_deactivationTime = 0.0;
      }
      lVar12 = lVar12 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  goto LAB_008b75df;
LAB_008b7547:
  lVar13 = lVar13 + 1;
  if (iVar15 == (int)lVar13) goto code_r0x008b754f;
  goto LAB_008b7523;
code_r0x008b754f:
  if (iVar14 <= iVar8) {
    do {
      pcVar3 = (local_48->m_collisionObjects).m_data
               [(local_38->m_unionFind).m_elements.m_data[lVar12].m_sz];
      if (pcVar3->m_islandTag1 == iVar1) {
        cbtCollisionObject::setActivationState(pcVar3,2);
      }
      lVar12 = lVar12 + 1;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
LAB_008b75df:
  this = local_38;
  iVar14 = iVar11;
  if (iVar4 <= iVar11) goto LAB_008b75ed;
  goto LAB_008b74c8;
}

Assistant:

void cbtSimulationIslandManager::buildIslands(cbtDispatcher* dispatcher, cbtCollisionWorld* collisionWorld)
{
	BT_PROFILE("islandUnionFindAndQuickSort");

	cbtCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	m_islandmanifold.resize(0);

	//we are going to sort the unionfind array, and store the element id in the size
	//afterwards, we clean unionfind, to make sure no-one uses it anymore

	getUnionFind().sortIslands();
	int numElem = getUnionFind().getNumElements();

	int endIslandIndex = 1;
	int startIslandIndex;

	//update the sleeping state for bodies, if all are sleeping
	for (startIslandIndex = 0; startIslandIndex < numElem; startIslandIndex = endIslandIndex)
	{
		int islandId = getUnionFind().getElement(startIslandIndex).m_id;
		for (endIslandIndex = startIslandIndex + 1; (endIslandIndex < numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId); endIslandIndex++)
		{
		}

		//int numSleeping = 0;

		bool allSleeping = true;

		int idx;
		for (idx = startIslandIndex; idx < endIslandIndex; idx++)
		{
			int i = getUnionFind().getElement(idx).m_sz;

			cbtCollisionObject* colObj0 = collisionObjects[i];
			if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
			{
				//				printf("error in island management\n");
			}

			cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));
			if (colObj0->getIslandTag() == islandId)
			{
				if (colObj0->getActivationState() == ACTIVE_TAG ||
					colObj0->getActivationState() == DISABLE_DEACTIVATION)
				{
					allSleeping = false;
					break;
				}
			}
		}

		if (allSleeping)
		{
			int idx;
			for (idx = startIslandIndex; idx < endIslandIndex; idx++)
			{
				int i = getUnionFind().getElement(idx).m_sz;
				cbtCollisionObject* colObj0 = collisionObjects[i];
				if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
				{
					//					printf("error in island management\n");
				}

				cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));

				if (colObj0->getIslandTag() == islandId)
				{
					colObj0->setActivationState(ISLAND_SLEEPING);
				}
			}
		}
		else
		{
			int idx;
			for (idx = startIslandIndex; idx < endIslandIndex; idx++)
			{
				int i = getUnionFind().getElement(idx).m_sz;

				cbtCollisionObject* colObj0 = collisionObjects[i];
				if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
				{
					//					printf("error in island management\n");
				}

				cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));

				if (colObj0->getIslandTag() == islandId)
				{
					if (colObj0->getActivationState() == ISLAND_SLEEPING)
					{
						colObj0->setActivationState(WANTS_DEACTIVATION);
						colObj0->setDeactivationTime(0.f);
					}
				}
			}
		}
	}

	int i;
	int maxNumManifolds = dispatcher->getNumManifolds();

	//#define SPLIT_ISLANDS 1
	//#ifdef SPLIT_ISLANDS

	//#endif //SPLIT_ISLANDS

	for (i = 0; i < maxNumManifolds; i++)
	{
		cbtPersistentManifold* manifold = dispatcher->getManifoldByIndexInternal(i);
		if (collisionWorld->getDispatchInfo().m_deterministicOverlappingPairs)
		{
			if (manifold->getNumContacts() == 0)
				continue;
		}

		const cbtCollisionObject* colObj0 = static_cast<const cbtCollisionObject*>(manifold->getBody0());
		const cbtCollisionObject* colObj1 = static_cast<const cbtCollisionObject*>(manifold->getBody1());

		///@todo: check sleeping conditions!
		if (((colObj0) && colObj0->getActivationState() != ISLAND_SLEEPING) ||
			((colObj1) && colObj1->getActivationState() != ISLAND_SLEEPING))
		{
			//kinematic objects don't merge islands, but wake up all connected objects
			if (colObj0->isKinematicObject() && colObj0->getActivationState() != ISLAND_SLEEPING)
			{
				if (colObj0->hasContactResponse())
					colObj1->activate();
			}
			if (colObj1->isKinematicObject() && colObj1->getActivationState() != ISLAND_SLEEPING)
			{
				if (colObj1->hasContactResponse())
					colObj0->activate();
			}
			if (m_splitIslands)
			{
				//filtering for response
				if (dispatcher->needsResponse(colObj0, colObj1))
					m_islandmanifold.push_back(manifold);
			}
		}
	}
}